

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O3

CTcDictEntry * __thiscall CTcParser::declare_dict(CTcParser *this,char *txt,size_t len)

{
  uint uVar1;
  char *str;
  size_t len_00;
  CVmHashEntry *this_00;
  CTcDictEntry *pCVar2;
  int errnum;
  
  this_00 = (CVmHashEntry *)CTcPrsSymtab::find(this->global_symtab_,txt,len,(CTcPrsSymtab **)0x0);
  if (this_00 == (CVmHashEntry *)0x0) {
    this_00 = (CVmHashEntry *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)txt);
    str = (G_tok->curtok_).text_;
    len_00 = (G_tok->curtok_).text_len_;
    uVar1 = G_cg->next_obj_;
    G_cg->next_obj_ = uVar1 + 1;
    CVmHashEntry::CVmHashEntry(this_00,str,len_00,0);
    *(undefined4 *)&this_00->field_0x24 = 2;
    this_00[1]._vptr_CVmHashEntry = (_func_int **)(ulong)uVar1;
    this_00[1].nxt_ = (CVmHashEntry *)0xffffffff;
    this_00[1].str_ = (char *)0x0;
    this_00[1].len_ = 0;
    *(undefined8 *)&this_00[1].field_0x20 = 0;
    this_00[2]._vptr_CVmHashEntry = (_func_int **)0x0;
    this_00[2].nxt_ = (CVmHashEntry *)0x0;
    *(undefined4 *)&this_00[3].len_ = 1;
    this_00[4].str_ = (char *)0x0;
    *(undefined8 *)&this_00[3].field_0x20 = 0;
    this_00[4]._vptr_CVmHashEntry = (_func_int **)0x0;
    *(undefined4 *)&this_00[4].nxt_ = 0;
    this_00[2].str_ = (char *)0x0;
    this_00[2].len_ = 0;
    *(undefined8 *)&this_00[2].field_0x20 = 0;
    this_00[3]._vptr_CVmHashEntry = (_func_int **)0x0;
    this_00[3].nxt_ = (CVmHashEntry *)0x0;
    this_00[3].str_ = (char *)0x0;
    *(ushort *)&this_00[4].len_ = (ushort)this_00[4].len_ & 0xf000;
    this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_003187b0;
    (*this->global_symtab_->_vptr_CTcPrsSymtab[3])(this->global_symtab_,this_00);
  }
  else {
    errnum = 0x2b60;
    if ((*(int *)&this_00->field_0x24 == 2) && (errnum = 0x2b79, (int)this_00[3].len_ == 1)) {
      if ((CTcDictEntry *)this_00[3].str_ != (CTcDictEntry *)0x0) {
        return (CTcDictEntry *)this_00[3].str_;
      }
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,errnum);
      this_00 = (CVmHashEntry *)0x0;
    }
  }
  pCVar2 = create_dict_entry(this,(CTcSymObj *)this_00);
  return pCVar2;
}

Assistant:

CTcDictEntry *CTcParser::declare_dict(const char *txt, size_t len)
{
    CTcSymObj *sym;
    CTcDictEntry *entry = 0;

    /* look up the symbol */
    sym = (CTcSymObj *)global_symtab_->find(txt, len);

    /* if it's not defined, add it; otherwise, make sure it's correct */
    if (sym == 0)
    {
        /* it's not yet defined - define it as a dictionary */
        sym = new CTcSymObj(G_tok->getcur()->get_text(),
                            G_tok->getcur()->get_text_len(),
                            FALSE, G_cg->new_obj_id(), FALSE,
                            TC_META_DICT, 0);

        /* add it to the global symbol table */
        global_symtab_->add_entry(sym);

        /* create a new dictionary entry */
        entry = create_dict_entry(sym);
    }
    else
    {
        /* make sure it's an object of metaclass 'dictionary' */
        if (sym->get_type() != TC_SYM_OBJ)
        {
            /* log an error */
            G_tok->log_error_curtok(TCERR_REDEF_AS_OBJ);

            /* forget the symbol - it's not even an object */
            sym = 0;
        }
        else if (sym->get_metaclass() != TC_META_DICT)
        {
            /* it's an object, but not a dictionary - log an error */
            G_tok->log_error_curtok(TCERR_REDEF_AS_DICT);

            /* forget the symbol */
            sym = 0;
        }

        /* find it in our dictionary list */
        entry = get_dict_entry(sym);

        /* 
         *   if we didn't find the entry, we must have loaded the symbol from
         *   a symbol file - add the dictionary list entry now 
         */
        if (entry == 0)
            entry = create_dict_entry(sym);
    }

    /* return the new dictionary object */
    return entry;
}